

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ResultBuilder * __thiscall
Catch::ExpressionLhs<std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>const&>::
captureExpression<(Catch::Internal::Operator)0,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>
          (ExpressionLhs<std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>const&> *this,
          vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *rhs)

{
  ResultBuilder *pRVar1;
  bool bVar2;
  OfType OVar3;
  __normal_iterator<const_PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  last;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  string local_58;
  string local_38;
  
  pRVar1 = *(ResultBuilder **)this;
  bVar2 = Internal::
          Evaluator<std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>,_(Catch::Internal::Operator)0>
          ::evaluate(*(vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> **)(this + 8),rhs);
  last._M_current = (PhyloTreeEdge *)0x0;
  OVar3 = ExpressionFailed;
  if (bVar2) {
    OVar3 = Ok;
  }
  (pRVar1->m_data).resultType = OVar3;
  Detail::
  rangeToString<__gnu_cxx::__normal_iterator<PhyloTreeEdge_const*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>>
            (&local_38,(Detail *)**(undefined8 **)(this + 8),
             (PhyloTreeEdge *)(*(undefined8 **)(this + 8))[1],
             (__normal_iterator<const_PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
              )0x0);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).lhs);
  Detail::
  rangeToString<__gnu_cxx::__normal_iterator<PhyloTreeEdge_const*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>>
            (&local_58,
             (Detail *)
             (rhs->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (rhs->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_finish,last);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).rhs);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"==","");
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).op);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }